

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::stop_election_timer(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  string local_30;
  
  if ((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    cancel_task(this,&this->election_task_);
    return;
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (2 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_30,
                 "Election Timer is never started but is requested to stop, protential a bug");
      (*peVar1->_vptr_logger[8])
                (peVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"stop_election_timer",0xc1,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

void raft_server::stop_election_timer() {
    if (!election_task_) {
        p_wn("Election Timer is never started but is "
             "requested to stop, protential a bug");
        return;
    }

    cancel_task(election_task_);
}